

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

void DelOld(PProfileList list,PProfile_conflict profile)

{
  PProfile_conflict pTVar1;
  PProfile *ppTVar2;
  
  do {
    ppTVar2 = list;
    pTVar1 = *ppTVar2;
    if (pTVar1 == (PProfile_conflict)0x0) {
      return;
    }
    list = &pTVar1->link;
  } while (pTVar1 != profile);
  *ppTVar2 = pTVar1->link;
  return;
}

Assistant:

static void
  DelOld( PProfileList    list,
          const PProfile  profile )
  {
    PProfile  *old, current;


    old     = list;
    current = *old;

    while ( current )
    {
      if ( current == profile )
      {
        *old = current->link;
        return;
      }

      old     = &current->link;
      current = *old;
    }

    /* we should never get there, unless the profile was not part of */
    /* the list.                                                     */
  }